

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::addCutoffGroup(Molecule *this,CutoffGroup *cp)

{
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  _Var1;
  CutoffGroup *local_10;
  
  local_10 = cp;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::CutoffGroup**,std::vector<OpenMD::CutoffGroup*,std::allocator<OpenMD::CutoffGroup*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::CutoffGroup*const>>
                    ((this->cutoffGroups_).
                     super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->cutoffGroups_).
                     super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->cutoffGroups_).
      super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>::push_back
              (&this->cutoffGroups_,&local_10);
  }
  return;
}

Assistant:

void Molecule::addCutoffGroup(CutoffGroup* cp) {
    if (std::find(cutoffGroups_.begin(), cutoffGroups_.end(), cp) ==
        cutoffGroups_.end()) {
      cutoffGroups_.push_back(cp);
    }
  }